

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

float __thiscall Assimp::CFIReaderImpl::getAttributeValueAsFloat(CFIReaderImpl *this,char *name)

{
  element_type *peVar1;
  int iVar2;
  ulong in_RAX;
  Attribute *pAVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined1 in_CL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  float fVar5;
  ai_real ret;
  undefined8 local_18;
  
  local_18 = in_RAX;
  pAVar3 = getAttributeByName(this,name);
  if (pAVar3 == (Attribute *)0x0) {
    fVar5 = 0.0;
  }
  else {
    peVar1 = (pAVar3->value).super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      lVar4 = 0;
    }
    else {
      in_CL = 0;
      lVar4 = __dynamic_cast(peVar1,&FIValue::typeinfo,&FIFloatValue::typeinfo);
    }
    if (lVar4 == 0) {
      lVar4 = 0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      this_00 = (pAVar3->value).
                super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        in_CL = 0x90;
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
    }
    if (lVar4 == 0) {
      iVar2 = (**((pAVar3->value).
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 _vptr_FIValue)();
      local_18 = local_18 & 0xffffffff;
      fast_atoreal_move<float>
                (*(Assimp **)CONCAT44(extraout_var,iVar2),(char *)((long)&local_18 + 4),(float *)0x1
                 ,(bool)in_CL);
      fVar5 = local_18._4_4_;
    }
    else {
      fVar5 = 0.0;
      if (*(long *)(lVar4 + 0x10) - (long)*(float **)(lVar4 + 8) == 4) {
        fVar5 = **(float **)(lVar4 + 8);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_18 = CONCAT44(local_18._4_4_,fVar5);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      fVar5 = (float)local_18;
    }
  }
  return fVar5;
}

Assistant:

virtual float getAttributeValueAsFloat(const char* name) const /*override*/ {
        const Attribute* attr = getAttributeByName(name);
        if (!attr) {
            return 0;
        }
        std::shared_ptr<const FIFloatValue> floatValue = std::dynamic_pointer_cast<const FIFloatValue>(attr->value);
        if (floatValue) {
            return floatValue->value.size() == 1 ? floatValue->value.front() : 0;
        }

        return fast_atof(attr->value->toString().c_str());
    }